

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,DSPOMDP *model,StateIndexer *indexer,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  log_ostream *plVar2;
  ostream *poVar3;
  int s;
  uint uVar4;
  double extraout_XMM0_Qa;
  State *particle;
  
  if (indexer != (StateIndexer *)0x0) {
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar4 = 0;
    while( true ) {
      iVar1 = (*indexer->_vptr_StateIndexer[2])(indexer);
      if (iVar1 <= (int)uVar4) break;
      iVar1 = (*indexer->_vptr_StateIndexer[4])(indexer,(ulong)uVar4);
      (*model->_vptr_DSPOMDP[7])(model,obs,CONCAT44(extraout_var,iVar1),(ulong)(uint)action);
      if (0.0 < extraout_XMM0_Qa) {
        iVar1 = (*model->_vptr_DSPOMDP[0x16])(model,CONCAT44(extraout_var,iVar1));
        particle = (State *)CONCAT44(extraout_var_00,iVar1);
        particle->weight = extraout_XMM0_Qa;
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  (__return_storage_ptr__,&particle);
      }
      uVar4 = uVar4 + 1;
    }
    return __return_storage_ptr__;
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (0 < iVar1) {
      plVar2 = logging::stream(1);
      poVar3 = std::operator<<(&plVar2->super_ostream,"[Belief::Resample] indexer cannot be null");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  exit(1);
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const DSPOMDP* model,
	const StateIndexer* indexer, ACT_TYPE action, OBS_TYPE obs) {
	if (indexer == NULL) {
		loge << "[Belief::Resample] indexer cannot be null" << endl;
		exit(1);
	}

	vector<State*> sample;

	for (int s = 0; s < indexer->NumStates(); s++) {
		const State* state = indexer->GetState(s);
		double prob = model->ObsProb(obs, *state, action);
		if (prob > 0) {
			State* particle = model->Copy(state);
			particle->weight = prob;
			sample.push_back(particle);
		}
	}

	return sample;
}